

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_net_methods.cpp
# Opt level: O3

void Marshall_int16_proc(int the_socket,Am_Value *in_value,Am_Connection *my_connection_ptr)

{
  int iVar1;
  short net_int16;
  ushort local_a;
  
  iVar1 = Am_Value::operator_cast_to_int(in_value);
  local_a = (ushort)iVar1 << 8 | (ushort)iVar1 >> 8;
  send(the_socket,&local_a,2,0);
  return;
}

Assistant:

Am_Define_Method(Am_Marshall_Method, void, Marshall_int16,
                 (int the_socket, const Am_Value &in_value,
                  Am_Connection *my_connection_ptr))
{
  (void)my_connection_ptr; //avoid warning,  used by Lists & Obj
  int in_int = (int)in_value;
  short in_int16 = (short)in_int;
  short net_int16;
  net_int16 = htons(in_int16);
  send(the_socket, &net_int16, sizeof(net_int16), 0);
}